

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_export.cpp
# Opt level: O2

bool duckdb::ReferencedTableIsOrdered(string *referenced_table,catalog_entry_vector_t *ordered)

{
  pointer prVar1;
  pointer prVar2;
  bool bVar3;
  pointer prVar4;
  reference_wrapper<duckdb::CatalogEntry> *entry;
  
  prVar1 = (ordered->
           super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  prVar2 = (ordered->
           super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    prVar4 = prVar2;
    if (prVar4 == prVar1) break;
    bVar3 = StringUtil::CIEquals(&prVar4->_M_data->name,referenced_table);
    prVar2 = prVar4 + 1;
  } while (!bVar3);
  return prVar4 != prVar1;
}

Assistant:

bool ReferencedTableIsOrdered(string &referenced_table, catalog_entry_vector_t &ordered) {
	for (auto &entry : ordered) {
		auto &table_entry = entry.get().Cast<TableCatalogEntry>();
		if (StringUtil::CIEquals(table_entry.name, referenced_table)) {
			// The referenced table is already ordered
			return true;
		}
	}
	return false;
}